

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void co_init_curr_thread_env(void)

{
  int iVar1;
  stCoRoutineEnv_t *env_00;
  void *pvVar2;
  stCoRoutine_t *psVar3;
  stCoEpoll_t *ev_00;
  long *in_FS_OFFSET;
  stCoEpoll_t *ev;
  stCoRoutine_t *self;
  stCoRoutineEnv_t *env;
  
  pvVar2 = calloc(1,0x420);
  *(void **)(*in_FS_OFFSET + -0x10) = pvVar2;
  env_00 = *(stCoRoutineEnv_t **)(*in_FS_OFFSET + -0x10);
  env_00->iCallStackSize = 0;
  psVar3 = co_create_env(env_00,(stCoRoutineAttr_t *)0x0,(pfn_co_routine_t)0x0,(void *)0x0);
  psVar3->cIsMain = '\x01';
  env_00->pending_co = (stCoRoutine_t *)0x0;
  env_00->occupy_co = (stCoRoutine_t *)0x0;
  coctx_init(&psVar3->ctx);
  iVar1 = env_00->iCallStackSize;
  env_00->iCallStackSize = iVar1 + 1;
  env_00->pCallStack[iVar1] = psVar3;
  ev_00 = AllocEpoll();
  SetEpoll(env_00,ev_00);
  return;
}

Assistant:

void co_init_curr_thread_env()
{
	gCoEnvPerThread = (stCoRoutineEnv_t*)calloc( 1, sizeof(stCoRoutineEnv_t) );
	stCoRoutineEnv_t *env = gCoEnvPerThread;

	env->iCallStackSize = 0;
	struct stCoRoutine_t *self = co_create_env( env, NULL, NULL,NULL );
	self->cIsMain = 1;

	env->pending_co = NULL;
	env->occupy_co = NULL;

	coctx_init( &self->ctx );

	env->pCallStack[ env->iCallStackSize++ ] = self;

	stCoEpoll_t *ev = AllocEpoll();
	SetEpoll( env,ev );
}